

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  U32 UVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  ZSTD_matchState_t *pZVar7;
  U32 *pUVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  U32 UVar23;
  U32 UVar24;
  U32 UVar25;
  BYTE *pBVar26;
  BYTE *pBVar27;
  BYTE *pBVar28;
  size_t sVar29;
  long lVar30;
  size_t sVar31;
  BYTE *pBVar32;
  ulong uVar33;
  bool bVar34;
  uint local_1004;
  U32 local_1000;
  BYTE *local_fe8;
  BYTE *local_fd8;
  BYTE *local_f98;
  BYTE *local_f88;
  uint local_f7c;
  U32 local_f78;
  BYTE *local_f60;
  BYTE *local_f50;
  BYTE *local_f10;
  BYTE *local_f00;
  uint local_ef4;
  U32 local_ef0;
  BYTE *local_ed8;
  BYTE *local_ec8;
  BYTE *local_e88;
  BYTE *local_e78;
  uint local_e6c;
  U32 local_e68;
  BYTE *local_e50;
  BYTE *local_e40;
  BYTE *local_e00;
  BYTE *local_df0;
  U32 mls;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOffset_3;
  size_t repLength2_3;
  BYTE *repEnd2_3;
  BYTE *repMatch2_3;
  U32 repIndex2_3;
  U32 current2_3;
  U32 offset_9;
  U32 offset_8;
  BYTE *dictMatch_3;
  U32 dictMatchIndex_3;
  size_t dictHash_3;
  BYTE *repMatchEnd_3;
  BYTE *repMatch_3;
  BYTE *pBStack_d48;
  U32 repIndex_3;
  BYTE *match_3;
  U32 matchIndex_3;
  U32 current_3;
  size_t h_3;
  size_t mLength_3;
  U32 endIndex_3;
  U32 maxDistance_3;
  U32 dictHLog_3;
  U32 dictAndPrefixLength_3;
  U32 dictIndexDelta_3;
  BYTE *dictEnd_3;
  BYTE *dictStart_3;
  BYTE *dictBase_3;
  U32 dictStartIndex_3;
  U32 *dictHashTable_3;
  ZSTD_compressionParameters *dictCParams_3;
  ZSTD_matchState_t *dms_3;
  uint local_cd0;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *prefixStart_3;
  BYTE *pBStack_ca8;
  U32 prefixStartIndex_3;
  BYTE *anchor_3;
  BYTE *ip_15;
  BYTE *istart_3;
  BYTE *base_3;
  U32 stepSize_3;
  U32 hlog_3;
  U32 *hashTable_3;
  ZSTD_compressionParameters *cParams_3;
  U32 tmpOffset_2;
  size_t repLength2_2;
  BYTE *repEnd2_2;
  BYTE *repMatch2_2;
  U32 repIndex2_2;
  U32 current2_2;
  U32 offset_7;
  U32 offset_6;
  BYTE *dictMatch_2;
  U32 dictMatchIndex_2;
  size_t dictHash_2;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  BYTE *pBStack_be0;
  U32 repIndex_2;
  BYTE *match_2;
  U32 matchIndex_2;
  U32 current_2;
  size_t h_2;
  size_t mLength_2;
  U32 endIndex_2;
  U32 maxDistance_2;
  U32 dictHLog_2;
  U32 dictAndPrefixLength_2;
  U32 dictIndexDelta_2;
  BYTE *dictEnd_2;
  BYTE *dictStart_2;
  BYTE *dictBase_2;
  U32 dictStartIndex_2;
  U32 *dictHashTable_2;
  ZSTD_compressionParameters *dictCParams_2;
  ZSTD_matchState_t *dms_2;
  uint local_b68;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *prefixStart_2;
  BYTE *pBStack_b40;
  U32 prefixStartIndex_2;
  BYTE *anchor_2;
  BYTE *ip_10;
  BYTE *istart_2;
  BYTE *base_2;
  U32 stepSize_2;
  U32 hlog_2;
  U32 *hashTable_2;
  ZSTD_compressionParameters *cParams_2;
  U32 tmpOffset_1;
  size_t repLength2_1;
  BYTE *repEnd2_1;
  BYTE *repMatch2_1;
  U32 repIndex2_1;
  U32 current2_1;
  U32 offset_5;
  U32 offset_4;
  BYTE *dictMatch_1;
  U32 dictMatchIndex_1;
  size_t dictHash_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  BYTE *pBStack_a78;
  U32 repIndex_1;
  BYTE *match_1;
  U32 matchIndex_1;
  U32 current_1;
  size_t h_1;
  size_t mLength_1;
  U32 endIndex_1;
  U32 maxDistance_1;
  U32 dictHLog_1;
  U32 dictAndPrefixLength_1;
  U32 dictIndexDelta_1;
  BYTE *dictEnd_1;
  BYTE *dictStart_1;
  BYTE *dictBase_1;
  U32 dictStartIndex_1;
  U32 *dictHashTable_1;
  ZSTD_compressionParameters *dictCParams_1;
  ZSTD_matchState_t *dms_1;
  uint local_a00;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixStart_1;
  BYTE *pBStack_9d8;
  U32 prefixStartIndex_1;
  BYTE *anchor_1;
  BYTE *ip_5;
  BYTE *istart_1;
  BYTE *base_1;
  U32 stepSize_1;
  U32 hlog_1;
  U32 *hashTable_1;
  ZSTD_compressionParameters *cParams_1;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 offset_3;
  U32 offset;
  BYTE *dictMatch;
  U32 dictMatchIndex;
  size_t dictHash;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_910;
  U32 repIndex;
  BYTE *match;
  U32 matchIndex;
  U32 current;
  size_t h;
  size_t mLength;
  U32 endIndex;
  U32 maxDistance;
  U32 dictHLog;
  U32 dictAndPrefixLength;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  U32 dictStartIndex;
  U32 *dictHashTable;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  uint local_898;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixStart;
  BYTE *pBStack_870;
  U32 prefixStartIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *base;
  U32 stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  BYTE *litEnd_4;
  BYTE *litLimit_w_4;
  BYTE *litEnd_5;
  BYTE *litLimit_w_5;
  BYTE *litEnd_7;
  BYTE *litLimit_w_7;
  BYTE *litEnd_6;
  BYTE *litLimit_w_6;
  BYTE *litEnd_8;
  BYTE *litLimit_w_8;
  BYTE *litEnd_9;
  BYTE *litLimit_w_9;
  BYTE *litEnd_11;
  BYTE *litLimit_w_11;
  BYTE *litEnd_10;
  BYTE *litLimit_w_10;
  BYTE *litEnd_12;
  BYTE *litLimit_w_12;
  BYTE *litEnd_13;
  BYTE *litLimit_w_13;
  BYTE *litEnd_15;
  BYTE *litLimit_w_15;
  BYTE *litEnd_14;
  BYTE *litLimit_w_14;
  BYTE *oend_14;
  BYTE *op_14;
  BYTE *ip_18;
  ptrdiff_t diff_14;
  BYTE *oend_15;
  BYTE *op_15;
  BYTE *ip_19;
  ptrdiff_t diff_15;
  BYTE *oend_13;
  BYTE *op_13;
  BYTE *ip_17;
  ptrdiff_t diff_13;
  BYTE *oend_12;
  BYTE *op_12;
  BYTE *ip_16;
  ptrdiff_t diff_12;
  BYTE *oend_10;
  BYTE *op_10;
  BYTE *ip_13;
  ptrdiff_t diff_10;
  BYTE *oend_11;
  BYTE *op_11;
  BYTE *ip_14;
  ptrdiff_t diff_11;
  BYTE *oend_9;
  BYTE *op_9;
  BYTE *ip_12;
  ptrdiff_t diff_9;
  BYTE *oend_8;
  BYTE *op_8;
  BYTE *ip_11;
  ptrdiff_t diff_8;
  BYTE *oend_6;
  BYTE *op_6;
  BYTE *ip_8;
  ptrdiff_t diff_6;
  BYTE *oend_7;
  BYTE *op_7;
  BYTE *ip_9;
  ptrdiff_t diff_7;
  BYTE *oend_5;
  BYTE *op_5;
  BYTE *ip_7;
  ptrdiff_t diff_5;
  BYTE *oend_4;
  BYTE *op_4;
  BYTE *ip_6;
  ptrdiff_t diff_4;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_4;
  ptrdiff_t diff_3;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  if (ms->dictMatchState == (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3e4d,
                  "size_t ZSTD_compressBlock_fast_dictMatchState(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  iVar16 = (int)srcSize;
  iVar15 = (int)src;
  switch((ms->cParams).minMatch) {
  default:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar18 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar6 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar26 = pBVar6 + uVar2;
    pBVar27 = (BYTE *)((long)src + srcSize);
    pBVar28 = pBVar27 + -8;
    offsetSaved = *rep;
    local_898 = rep[1];
    pZVar7 = ms->dictMatchState;
    pUVar8 = pZVar7->hashTable;
    uVar3 = (pZVar7->window).dictLimit;
    pBVar9 = (pZVar7->window).base;
    pBVar10 = (pZVar7->window).nextSrc;
    iVar12 = (int)pBVar10;
    uVar19 = uVar2 - (iVar12 - (int)pBVar9);
    iVar13 = (iVar15 - (int)pBVar26) + iVar12;
    iVar14 = (int)(pBVar9 + uVar3);
    uVar20 = iVar13 - iVar14;
    UVar4 = (pZVar7->cParams).hashLog;
    iVar17 = (int)pBVar6;
    if ((uint)(1 << ((byte)(ms->cParams).windowLog & 0x1f)) < ((iVar15 - iVar17) + iVar16) - uVar2)
    {
      __assert_fail("endIndex - prefixStartIndex <= maxDistance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3dd8,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (uVar2 < (uint)(iVar12 - (int)pBVar9)) {
      __assert_fail("prefixStartIndex >= (U32)(dictEnd - dictBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3ddd,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    anchor = (BYTE *)((long)src + (long)(int)(uint)(iVar13 == iVar14));
    if (uVar20 < offsetSaved) {
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3de4,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    pBStack_870 = (BYTE *)src;
    if (uVar20 < local_898) {
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3de5,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
LAB_001774f7:
    UVar25 = offsetSaved;
    if (anchor < pBVar28) {
      sVar29 = ZSTD_hashPtr(anchor,UVar1,4);
      uVar21 = (int)anchor - iVar17;
      uVar20 = pUVar5[sVar29];
      pBStack_910 = pBVar6 + uVar20;
      uVar22 = (uVar21 + 1) - offsetSaved;
      if (uVar22 < uVar2) {
        local_df0 = pBVar9 + (uVar22 - uVar19);
      }
      else {
        local_df0 = pBVar6 + uVar22;
      }
      pUVar5[sVar29] = uVar21;
      if ((uVar2 - 1) - uVar22 < 3) {
LAB_00177be1:
        if (uVar2 < uVar20) {
          UVar23 = MEM_read32(pBStack_910);
          UVar24 = MEM_read32(anchor);
          if (UVar23 == UVar24) {
            offsetSaved = (int)anchor - (int)pBStack_910;
            sVar29 = ZSTD_count(anchor + 4,pBStack_910 + 4,pBVar27);
            h = sVar29 + 4;
            while( true ) {
              bVar34 = false;
              if (pBStack_870 < anchor && pBVar26 < pBStack_910) {
                bVar34 = anchor[-1] == pBStack_910[-1];
              }
              if (!bVar34) break;
              anchor = anchor + -1;
              pBStack_910 = pBStack_910 + -1;
              h = h + 1;
            }
            uVar33 = (long)anchor - (long)pBStack_870;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar33) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 < pBStack_870 + uVar33) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 + -0x20 < pBStack_870 + uVar33) {
              ZSTD_safecopyLiterals(seqStore->lit,pBStack_870,pBStack_870 + uVar33,pBVar27 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,pBStack_870);
              if (0x10 < uVar33) {
                pBVar11 = seqStore->lit;
                pBVar32 = pBVar11 + 0x10;
                lVar30 = (long)pBVar32 - (long)(pBStack_870 + 0x10);
                if (lVar30 < 8 && -0x10 < lVar30) {
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                if (lVar30 < 0x10 && -0x10 < lVar30) {
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1270,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                ZSTD_copy16(pBVar32,pBStack_870 + 0x10);
                while (pBVar11 = pBVar11 + 0x20, pBVar11 < pBVar32 + (uVar33 - 0x10)) {
                  op_2 = pBStack_870 + 0x20;
                  ZSTD_copy16(pBVar11,op_2);
                  ZSTD_copy16(pBVar11 + 0x10,pBStack_870 + 0x30);
                  pBStack_870 = op_2;
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar33;
            if (0xffff < uVar33) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar33;
            seqStore->sequences->offset = offsetSaved + 3;
            if (0xffff < h - 3) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(h - 3);
            seqStore->sequences = seqStore->sequences + 1;
LAB_00178a3c:
            local_898 = UVar25;
            goto LAB_00178a3e;
          }
          if (uVar18 == 0) {
            __assert_fail("stepSize >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3e11,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          anchor = anchor + ((long)anchor - (long)pBStack_870 >> 8) + (ulong)uVar18;
        }
        else {
          sVar29 = ZSTD_hashPtr(anchor,UVar4,4);
          uVar20 = pUVar8[sVar29];
          _offset_3 = pBVar9 + uVar20;
          if (uVar3 < uVar20) {
            UVar23 = MEM_read32(_offset_3);
            UVar24 = MEM_read32(anchor);
            if (UVar23 == UVar24) {
              offsetSaved = (uVar21 - uVar20) - uVar19;
              sVar29 = ZSTD_count_2segments(anchor + 4,_offset_3 + 4,pBVar27,pBVar10,pBVar26);
              h = sVar29 + 4;
              while( true ) {
                bVar34 = false;
                if (pBStack_870 < anchor && pBVar9 + uVar3 < _offset_3) {
                  bVar34 = anchor[-1] == _offset_3[-1];
                }
                if (!bVar34) break;
                anchor = anchor + -1;
                _offset_3 = _offset_3 + -1;
                h = h + 1;
              }
              uVar33 = (long)anchor - (long)pBStack_870;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
                __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2038,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (0x20000 < seqStore->maxNbLit) {
                __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203a,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar33) {
                __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203b,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (pBVar27 < pBStack_870 + uVar33) {
                __assert_fail("literals + litLength <= litLimit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203c,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (pBVar27 + -0x20 < pBStack_870 + uVar33) {
                ZSTD_safecopyLiterals
                          (seqStore->lit,pBStack_870,pBStack_870 + uVar33,pBVar27 + -0x20);
              }
              else {
                ZSTD_copy16(seqStore->lit,pBStack_870);
                if (0x10 < uVar33) {
                  pBVar11 = seqStore->lit;
                  pBVar32 = pBVar11 + 0x10;
                  lVar30 = (long)pBVar32 - (long)(pBStack_870 + 0x10);
                  if (lVar30 < 8 && -0x10 < lVar30) {
                    __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1268,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  if (lVar30 < 0x10 && -0x10 < lVar30) {
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1270,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  ZSTD_copy16(pBVar32,pBStack_870 + 0x10);
                  while (pBVar11 = pBVar11 + 0x20, pBVar11 < pBVar32 + (uVar33 - 0x10)) {
                    op_1 = pBStack_870 + 0x20;
                    ZSTD_copy16(pBVar11,op_1);
                    ZSTD_copy16(pBVar11 + 0x10,pBStack_870 + 0x30);
                    pBStack_870 = op_1;
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar33;
              if (0xffff < uVar33) {
                if (seqStore->longLengthID != 0) {
                  __assert_fail("seqStorePtr->longLengthID == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x204d,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->litLength = (U16)uVar33;
              seqStore->sequences->offset = offsetSaved + 3;
              if (0xffff < h - 3) {
                if (seqStore->longLengthID != 0) {
                  __assert_fail("seqStorePtr->longLengthID == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x2058,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->matchLength = (U16)(h - 3);
              seqStore->sequences = seqStore->sequences + 1;
              goto LAB_00178a3c;
            }
          }
          if (uVar18 == 0) {
            __assert_fail("stepSize >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3e00,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          anchor = anchor + ((long)anchor - (long)pBStack_870 >> 8) + (ulong)uVar18;
        }
      }
      else {
        UVar23 = MEM_read32(local_df0);
        UVar24 = MEM_read32(anchor + 1);
        if (UVar23 != UVar24) goto LAB_00177be1;
        local_e00 = pBVar27;
        if (uVar22 < uVar2) {
          local_e00 = pBVar10;
        }
        sVar29 = ZSTD_count_2segments(anchor + 5,local_df0 + 4,pBVar27,local_e00,pBVar26);
        h = sVar29 + 4;
        anchor = anchor + 1;
        uVar33 = (long)anchor - (long)pBStack_870;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar33) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar27 < pBStack_870 + uVar33) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar27 + -0x20 < pBStack_870 + uVar33) {
          ZSTD_safecopyLiterals(seqStore->lit,pBStack_870,pBStack_870 + uVar33,pBVar27 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,pBStack_870);
          if (0x10 < uVar33) {
            pBVar11 = seqStore->lit;
            pBVar32 = pBVar11 + 0x10;
            lVar30 = (long)pBVar32 - (long)(pBStack_870 + 0x10);
            if (lVar30 < 8 && -0x10 < lVar30) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar30 < 0x10 && -0x10 < lVar30) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar32,pBStack_870 + 0x10);
            while (pBVar11 = pBVar11 + 0x20, pBVar11 < pBVar32 + (uVar33 - 0x10)) {
              op = pBStack_870 + 0x20;
              ZSTD_copy16(pBVar11,op);
              ZSTD_copy16(pBVar11 + 0x10,pBStack_870 + 0x30);
              pBStack_870 = op;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar33;
        if (0xffff < uVar33) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar33;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar29 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar29 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_00178a3e:
        pBStack_870 = anchor + h;
        anchor = pBStack_870;
        if (pBStack_870 <= pBVar28) {
          if (pBVar6 + (ulong)uVar21 + 2 <= src) {
            __assert_fail("base+current+2 > istart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3e25,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          sVar29 = ZSTD_hashPtr(pBVar6 + (ulong)uVar21 + 2,UVar1,4);
          pUVar5[sVar29] = uVar21 + 2;
          sVar29 = ZSTD_hashPtr(pBStack_870 + -2,UVar1,4);
          pUVar5[sVar29] = ((int)pBStack_870 + -2) - iVar17;
          for (; uVar20 = local_898, pBStack_870 = anchor, anchor <= pBVar28;
              anchor = anchor + sVar29 + 4) {
            UVar25 = (int)anchor - iVar17;
            uVar21 = UVar25 - local_898;
            if (uVar21 < uVar2) {
              local_e40 = pBVar9 + ((ulong)uVar21 - (ulong)uVar19);
            }
            else {
              local_e40 = pBVar6 + uVar21;
            }
            if ((uVar2 - 1) - uVar21 < 3) break;
            UVar23 = MEM_read32(local_e40);
            UVar24 = MEM_read32(anchor);
            if (UVar23 != UVar24) break;
            local_e50 = pBVar27;
            if (uVar21 < uVar2) {
              local_e50 = pBVar10;
            }
            sVar29 = ZSTD_count_2segments(anchor + 4,local_e40 + 4,pBVar27,local_e50,pBVar26);
            local_898 = offsetSaved;
            offsetSaved = uVar20;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 < anchor) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 + -0x20 < anchor) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,pBVar27 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar29 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar29 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            sVar31 = ZSTD_hashPtr(anchor,UVar1,4);
            pUVar5[sVar31] = UVar25;
          }
        }
      }
      goto LAB_001774f7;
    }
    if (offsetSaved == 0) {
      local_e68 = 0;
    }
    else {
      local_e68 = offsetSaved;
    }
    *rep = local_e68;
    if (local_898 == 0) {
      local_e6c = 0;
    }
    else {
      local_e6c = local_898;
    }
    rep[1] = local_e6c;
    ms_local = (ZSTD_matchState_t *)(pBVar27 + -(long)pBStack_870);
    break;
  case 5:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar18 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar6 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar26 = pBVar6 + uVar2;
    pBVar27 = (BYTE *)((long)src + srcSize);
    pBVar28 = pBVar27 + -8;
    offsetSaved_1 = *rep;
    local_a00 = rep[1];
    pZVar7 = ms->dictMatchState;
    pUVar8 = pZVar7->hashTable;
    uVar3 = (pZVar7->window).dictLimit;
    pBVar9 = (pZVar7->window).base;
    pBVar10 = (pZVar7->window).nextSrc;
    iVar12 = (int)pBVar10;
    uVar19 = uVar2 - (iVar12 - (int)pBVar9);
    iVar13 = (iVar15 - (int)pBVar26) + iVar12;
    iVar14 = (int)(pBVar9 + uVar3);
    uVar20 = iVar13 - iVar14;
    UVar4 = (pZVar7->cParams).hashLog;
    iVar17 = (int)pBVar6;
    if ((uint)(1 << ((byte)(ms->cParams).windowLog & 0x1f)) < ((iVar15 - iVar17) + iVar16) - uVar2)
    {
      __assert_fail("endIndex - prefixStartIndex <= maxDistance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3dd8,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (uVar2 < (uint)(iVar12 - (int)pBVar9)) {
      __assert_fail("prefixStartIndex >= (U32)(dictEnd - dictBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3ddd,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    anchor_1 = (BYTE *)((long)src + (long)(int)(uint)(iVar13 == iVar14));
    if (uVar20 < offsetSaved_1) {
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3de4,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    pBStack_9d8 = (BYTE *)src;
    if (uVar20 < local_a00) {
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3de5,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
LAB_001796df:
    UVar25 = offsetSaved_1;
    if (anchor_1 < pBVar28) {
      sVar29 = ZSTD_hashPtr(anchor_1,UVar1,5);
      uVar21 = (int)anchor_1 - iVar17;
      uVar20 = pUVar5[sVar29];
      pBStack_a78 = pBVar6 + uVar20;
      uVar22 = (uVar21 + 1) - offsetSaved_1;
      if (uVar22 < uVar2) {
        local_e78 = pBVar9 + (uVar22 - uVar19);
      }
      else {
        local_e78 = pBVar6 + uVar22;
      }
      pUVar5[sVar29] = uVar21;
      if ((uVar2 - 1) - uVar22 < 3) {
LAB_00179e65:
        if (uVar2 < uVar20) {
          UVar23 = MEM_read32(pBStack_a78);
          UVar24 = MEM_read32(anchor_1);
          if (UVar23 == UVar24) {
            offsetSaved_1 = (int)anchor_1 - (int)pBStack_a78;
            sVar29 = ZSTD_count(anchor_1 + 4,pBStack_a78 + 4,pBVar27);
            h_1 = sVar29 + 4;
            while( true ) {
              bVar34 = false;
              if (pBStack_9d8 < anchor_1 && pBVar26 < pBStack_a78) {
                bVar34 = anchor_1[-1] == pBStack_a78[-1];
              }
              if (!bVar34) break;
              anchor_1 = anchor_1 + -1;
              pBStack_a78 = pBStack_a78 + -1;
              h_1 = h_1 + 1;
            }
            uVar33 = (long)anchor_1 - (long)pBStack_9d8;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar33) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 < pBStack_9d8 + uVar33) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 + -0x20 < pBStack_9d8 + uVar33) {
              ZSTD_safecopyLiterals(seqStore->lit,pBStack_9d8,pBStack_9d8 + uVar33,pBVar27 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,pBStack_9d8);
              if (0x10 < uVar33) {
                pBVar11 = seqStore->lit;
                pBVar32 = pBVar11 + 0x10;
                lVar30 = (long)pBVar32 - (long)(pBStack_9d8 + 0x10);
                if (lVar30 < 8 && -0x10 < lVar30) {
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                if (lVar30 < 0x10 && -0x10 < lVar30) {
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1270,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                ZSTD_copy16(pBVar32,pBStack_9d8 + 0x10);
                while (pBVar11 = pBVar11 + 0x20, pBVar11 < pBVar32 + (uVar33 - 0x10)) {
                  op_6 = pBStack_9d8 + 0x20;
                  ZSTD_copy16(pBVar11,op_6);
                  ZSTD_copy16(pBVar11 + 0x10,pBStack_9d8 + 0x30);
                  pBStack_9d8 = op_6;
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar33;
            if (0xffff < uVar33) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar33;
            seqStore->sequences->offset = offsetSaved_1 + 3;
            if (0xffff < h_1 - 3) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(h_1 - 3);
            seqStore->sequences = seqStore->sequences + 1;
LAB_0017ad5c:
            local_a00 = UVar25;
            goto LAB_0017ad5e;
          }
          if (uVar18 == 0) {
            __assert_fail("stepSize >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3e11,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          anchor_1 = anchor_1 + ((long)anchor_1 - (long)pBStack_9d8 >> 8) + (ulong)uVar18;
        }
        else {
          sVar29 = ZSTD_hashPtr(anchor_1,UVar4,5);
          uVar20 = pUVar8[sVar29];
          _offset_5 = pBVar9 + uVar20;
          if (uVar3 < uVar20) {
            UVar23 = MEM_read32(_offset_5);
            UVar24 = MEM_read32(anchor_1);
            if (UVar23 == UVar24) {
              offsetSaved_1 = (uVar21 - uVar20) - uVar19;
              sVar29 = ZSTD_count_2segments(anchor_1 + 4,_offset_5 + 4,pBVar27,pBVar10,pBVar26);
              h_1 = sVar29 + 4;
              while( true ) {
                bVar34 = false;
                if (pBStack_9d8 < anchor_1 && pBVar9 + uVar3 < _offset_5) {
                  bVar34 = anchor_1[-1] == _offset_5[-1];
                }
                if (!bVar34) break;
                anchor_1 = anchor_1 + -1;
                _offset_5 = _offset_5 + -1;
                h_1 = h_1 + 1;
              }
              uVar33 = (long)anchor_1 - (long)pBStack_9d8;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
                __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2038,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (0x20000 < seqStore->maxNbLit) {
                __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203a,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar33) {
                __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203b,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (pBVar27 < pBStack_9d8 + uVar33) {
                __assert_fail("literals + litLength <= litLimit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203c,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (pBVar27 + -0x20 < pBStack_9d8 + uVar33) {
                ZSTD_safecopyLiterals
                          (seqStore->lit,pBStack_9d8,pBStack_9d8 + uVar33,pBVar27 + -0x20);
              }
              else {
                ZSTD_copy16(seqStore->lit,pBStack_9d8);
                if (0x10 < uVar33) {
                  pBVar11 = seqStore->lit;
                  pBVar32 = pBVar11 + 0x10;
                  lVar30 = (long)pBVar32 - (long)(pBStack_9d8 + 0x10);
                  if (lVar30 < 8 && -0x10 < lVar30) {
                    __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1268,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  if (lVar30 < 0x10 && -0x10 < lVar30) {
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1270,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  ZSTD_copy16(pBVar32,pBStack_9d8 + 0x10);
                  while (pBVar11 = pBVar11 + 0x20, pBVar11 < pBVar32 + (uVar33 - 0x10)) {
                    op_5 = pBStack_9d8 + 0x20;
                    ZSTD_copy16(pBVar11,op_5);
                    ZSTD_copy16(pBVar11 + 0x10,pBStack_9d8 + 0x30);
                    pBStack_9d8 = op_5;
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar33;
              if (0xffff < uVar33) {
                if (seqStore->longLengthID != 0) {
                  __assert_fail("seqStorePtr->longLengthID == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x204d,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->litLength = (U16)uVar33;
              seqStore->sequences->offset = offsetSaved_1 + 3;
              if (0xffff < h_1 - 3) {
                if (seqStore->longLengthID != 0) {
                  __assert_fail("seqStorePtr->longLengthID == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x2058,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->matchLength = (U16)(h_1 - 3);
              seqStore->sequences = seqStore->sequences + 1;
              goto LAB_0017ad5c;
            }
          }
          if (uVar18 == 0) {
            __assert_fail("stepSize >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3e00,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          anchor_1 = anchor_1 + ((long)anchor_1 - (long)pBStack_9d8 >> 8) + (ulong)uVar18;
        }
      }
      else {
        UVar23 = MEM_read32(local_e78);
        UVar24 = MEM_read32(anchor_1 + 1);
        if (UVar23 != UVar24) goto LAB_00179e65;
        local_e88 = pBVar27;
        if (uVar22 < uVar2) {
          local_e88 = pBVar10;
        }
        sVar29 = ZSTD_count_2segments(anchor_1 + 5,local_e78 + 4,pBVar27,local_e88,pBVar26);
        h_1 = sVar29 + 4;
        anchor_1 = anchor_1 + 1;
        uVar33 = (long)anchor_1 - (long)pBStack_9d8;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar33) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar27 < pBStack_9d8 + uVar33) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar27 + -0x20 < pBStack_9d8 + uVar33) {
          ZSTD_safecopyLiterals(seqStore->lit,pBStack_9d8,pBStack_9d8 + uVar33,pBVar27 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,pBStack_9d8);
          if (0x10 < uVar33) {
            pBVar11 = seqStore->lit;
            pBVar32 = pBVar11 + 0x10;
            lVar30 = (long)pBVar32 - (long)(pBStack_9d8 + 0x10);
            if (lVar30 < 8 && -0x10 < lVar30) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar30 < 0x10 && -0x10 < lVar30) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar32,pBStack_9d8 + 0x10);
            while (pBVar11 = pBVar11 + 0x20, pBVar11 < pBVar32 + (uVar33 - 0x10)) {
              op_4 = pBStack_9d8 + 0x20;
              ZSTD_copy16(pBVar11,op_4);
              ZSTD_copy16(pBVar11 + 0x10,pBStack_9d8 + 0x30);
              pBStack_9d8 = op_4;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar33;
        if (0xffff < uVar33) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar33;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar29 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar29 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_0017ad5e:
        pBStack_9d8 = anchor_1 + h_1;
        anchor_1 = pBStack_9d8;
        if (pBStack_9d8 <= pBVar28) {
          if (pBVar6 + (ulong)uVar21 + 2 <= src) {
            __assert_fail("base+current+2 > istart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3e25,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          sVar29 = ZSTD_hashPtr(pBVar6 + (ulong)uVar21 + 2,UVar1,5);
          pUVar5[sVar29] = uVar21 + 2;
          sVar29 = ZSTD_hashPtr(pBStack_9d8 + -2,UVar1,5);
          pUVar5[sVar29] = ((int)pBStack_9d8 + -2) - iVar17;
          for (; uVar20 = local_a00, pBStack_9d8 = anchor_1, anchor_1 <= pBVar28;
              anchor_1 = anchor_1 + sVar29 + 4) {
            UVar25 = (int)anchor_1 - iVar17;
            uVar21 = UVar25 - local_a00;
            if (uVar21 < uVar2) {
              local_ec8 = pBVar9 + ((ulong)uVar21 - (ulong)uVar19);
            }
            else {
              local_ec8 = pBVar6 + uVar21;
            }
            if ((uVar2 - 1) - uVar21 < 3) break;
            UVar23 = MEM_read32(local_ec8);
            UVar24 = MEM_read32(anchor_1);
            if (UVar23 != UVar24) break;
            local_ed8 = pBVar27;
            if (uVar21 < uVar2) {
              local_ed8 = pBVar10;
            }
            sVar29 = ZSTD_count_2segments(anchor_1 + 4,local_ec8 + 4,pBVar27,local_ed8,pBVar26);
            local_a00 = offsetSaved_1;
            offsetSaved_1 = uVar20;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 < anchor_1) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 + -0x20 < anchor_1) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_1,anchor_1,pBVar27 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_1);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar29 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar29 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            sVar31 = ZSTD_hashPtr(anchor_1,UVar1,5);
            pUVar5[sVar31] = UVar25;
          }
        }
      }
      goto LAB_001796df;
    }
    if (offsetSaved_1 == 0) {
      local_ef0 = 0;
    }
    else {
      local_ef0 = offsetSaved_1;
    }
    *rep = local_ef0;
    if (local_a00 == 0) {
      local_ef4 = 0;
    }
    else {
      local_ef4 = local_a00;
    }
    rep[1] = local_ef4;
    ms_local = (ZSTD_matchState_t *)(pBVar27 + -(long)pBStack_9d8);
    break;
  case 6:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar18 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar6 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar26 = pBVar6 + uVar2;
    pBVar27 = (BYTE *)((long)src + srcSize);
    pBVar28 = pBVar27 + -8;
    offsetSaved_2 = *rep;
    local_b68 = rep[1];
    pZVar7 = ms->dictMatchState;
    pUVar8 = pZVar7->hashTable;
    uVar3 = (pZVar7->window).dictLimit;
    pBVar9 = (pZVar7->window).base;
    pBVar10 = (pZVar7->window).nextSrc;
    iVar12 = (int)pBVar10;
    uVar19 = uVar2 - (iVar12 - (int)pBVar9);
    iVar13 = (iVar15 - (int)pBVar26) + iVar12;
    iVar14 = (int)(pBVar9 + uVar3);
    uVar20 = iVar13 - iVar14;
    UVar4 = (pZVar7->cParams).hashLog;
    iVar17 = (int)pBVar6;
    if ((uint)(1 << ((byte)(ms->cParams).windowLog & 0x1f)) < ((iVar15 - iVar17) + iVar16) - uVar2)
    {
      __assert_fail("endIndex - prefixStartIndex <= maxDistance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3dd8,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (uVar2 < (uint)(iVar12 - (int)pBVar9)) {
      __assert_fail("prefixStartIndex >= (U32)(dictEnd - dictBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3ddd,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    anchor_2 = (BYTE *)((long)src + (long)(int)(uint)(iVar13 == iVar14));
    if (uVar20 < offsetSaved_2) {
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3de4,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    pBStack_b40 = (BYTE *)src;
    if (uVar20 < local_b68) {
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3de5,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
LAB_0017b9ff:
    UVar25 = offsetSaved_2;
    if (anchor_2 < pBVar28) {
      sVar29 = ZSTD_hashPtr(anchor_2,UVar1,6);
      uVar21 = (int)anchor_2 - iVar17;
      uVar20 = pUVar5[sVar29];
      pBStack_be0 = pBVar6 + uVar20;
      uVar22 = (uVar21 + 1) - offsetSaved_2;
      if (uVar22 < uVar2) {
        local_f00 = pBVar9 + (uVar22 - uVar19);
      }
      else {
        local_f00 = pBVar6 + uVar22;
      }
      pUVar5[sVar29] = uVar21;
      if ((uVar2 - 1) - uVar22 < 3) {
LAB_0017c185:
        if (uVar2 < uVar20) {
          UVar23 = MEM_read32(pBStack_be0);
          UVar24 = MEM_read32(anchor_2);
          if (UVar23 == UVar24) {
            offsetSaved_2 = (int)anchor_2 - (int)pBStack_be0;
            sVar29 = ZSTD_count(anchor_2 + 4,pBStack_be0 + 4,pBVar27);
            h_2 = sVar29 + 4;
            while( true ) {
              bVar34 = false;
              if (pBStack_b40 < anchor_2 && pBVar26 < pBStack_be0) {
                bVar34 = anchor_2[-1] == pBStack_be0[-1];
              }
              if (!bVar34) break;
              anchor_2 = anchor_2 + -1;
              pBStack_be0 = pBStack_be0 + -1;
              h_2 = h_2 + 1;
            }
            uVar33 = (long)anchor_2 - (long)pBStack_b40;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar33) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 < pBStack_b40 + uVar33) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 + -0x20 < pBStack_b40 + uVar33) {
              ZSTD_safecopyLiterals(seqStore->lit,pBStack_b40,pBStack_b40 + uVar33,pBVar27 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,pBStack_b40);
              if (0x10 < uVar33) {
                pBVar11 = seqStore->lit;
                pBVar32 = pBVar11 + 0x10;
                lVar30 = (long)pBVar32 - (long)(pBStack_b40 + 0x10);
                if (lVar30 < 8 && -0x10 < lVar30) {
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                if (lVar30 < 0x10 && -0x10 < lVar30) {
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1270,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                ZSTD_copy16(pBVar32,pBStack_b40 + 0x10);
                while (pBVar11 = pBVar11 + 0x20, pBVar11 < pBVar32 + (uVar33 - 0x10)) {
                  op_10 = pBStack_b40 + 0x20;
                  ZSTD_copy16(pBVar11,op_10);
                  ZSTD_copy16(pBVar11 + 0x10,pBStack_b40 + 0x30);
                  pBStack_b40 = op_10;
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar33;
            if (0xffff < uVar33) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar33;
            seqStore->sequences->offset = offsetSaved_2 + 3;
            if (0xffff < h_2 - 3) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(h_2 - 3);
            seqStore->sequences = seqStore->sequences + 1;
LAB_0017d07c:
            local_b68 = UVar25;
            goto LAB_0017d07e;
          }
          if (uVar18 == 0) {
            __assert_fail("stepSize >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3e11,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          anchor_2 = anchor_2 + ((long)anchor_2 - (long)pBStack_b40 >> 8) + (ulong)uVar18;
        }
        else {
          sVar29 = ZSTD_hashPtr(anchor_2,UVar4,6);
          uVar20 = pUVar8[sVar29];
          _offset_7 = pBVar9 + uVar20;
          if (uVar3 < uVar20) {
            UVar23 = MEM_read32(_offset_7);
            UVar24 = MEM_read32(anchor_2);
            if (UVar23 == UVar24) {
              offsetSaved_2 = (uVar21 - uVar20) - uVar19;
              sVar29 = ZSTD_count_2segments(anchor_2 + 4,_offset_7 + 4,pBVar27,pBVar10,pBVar26);
              h_2 = sVar29 + 4;
              while( true ) {
                bVar34 = false;
                if (pBStack_b40 < anchor_2 && pBVar9 + uVar3 < _offset_7) {
                  bVar34 = anchor_2[-1] == _offset_7[-1];
                }
                if (!bVar34) break;
                anchor_2 = anchor_2 + -1;
                _offset_7 = _offset_7 + -1;
                h_2 = h_2 + 1;
              }
              uVar33 = (long)anchor_2 - (long)pBStack_b40;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
                __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2038,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (0x20000 < seqStore->maxNbLit) {
                __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203a,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar33) {
                __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203b,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (pBVar27 < pBStack_b40 + uVar33) {
                __assert_fail("literals + litLength <= litLimit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203c,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (pBVar27 + -0x20 < pBStack_b40 + uVar33) {
                ZSTD_safecopyLiterals
                          (seqStore->lit,pBStack_b40,pBStack_b40 + uVar33,pBVar27 + -0x20);
              }
              else {
                ZSTD_copy16(seqStore->lit,pBStack_b40);
                if (0x10 < uVar33) {
                  pBVar11 = seqStore->lit;
                  pBVar32 = pBVar11 + 0x10;
                  lVar30 = (long)pBVar32 - (long)(pBStack_b40 + 0x10);
                  if (lVar30 < 8 && -0x10 < lVar30) {
                    __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1268,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  if (lVar30 < 0x10 && -0x10 < lVar30) {
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1270,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  ZSTD_copy16(pBVar32,pBStack_b40 + 0x10);
                  while (pBVar11 = pBVar11 + 0x20, pBVar11 < pBVar32 + (uVar33 - 0x10)) {
                    op_9 = pBStack_b40 + 0x20;
                    ZSTD_copy16(pBVar11,op_9);
                    ZSTD_copy16(pBVar11 + 0x10,pBStack_b40 + 0x30);
                    pBStack_b40 = op_9;
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar33;
              if (0xffff < uVar33) {
                if (seqStore->longLengthID != 0) {
                  __assert_fail("seqStorePtr->longLengthID == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x204d,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->litLength = (U16)uVar33;
              seqStore->sequences->offset = offsetSaved_2 + 3;
              if (0xffff < h_2 - 3) {
                if (seqStore->longLengthID != 0) {
                  __assert_fail("seqStorePtr->longLengthID == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x2058,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->matchLength = (U16)(h_2 - 3);
              seqStore->sequences = seqStore->sequences + 1;
              goto LAB_0017d07c;
            }
          }
          if (uVar18 == 0) {
            __assert_fail("stepSize >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3e00,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          anchor_2 = anchor_2 + ((long)anchor_2 - (long)pBStack_b40 >> 8) + (ulong)uVar18;
        }
      }
      else {
        UVar23 = MEM_read32(local_f00);
        UVar24 = MEM_read32(anchor_2 + 1);
        if (UVar23 != UVar24) goto LAB_0017c185;
        local_f10 = pBVar27;
        if (uVar22 < uVar2) {
          local_f10 = pBVar10;
        }
        sVar29 = ZSTD_count_2segments(anchor_2 + 5,local_f00 + 4,pBVar27,local_f10,pBVar26);
        h_2 = sVar29 + 4;
        anchor_2 = anchor_2 + 1;
        uVar33 = (long)anchor_2 - (long)pBStack_b40;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar33) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar27 < pBStack_b40 + uVar33) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar27 + -0x20 < pBStack_b40 + uVar33) {
          ZSTD_safecopyLiterals(seqStore->lit,pBStack_b40,pBStack_b40 + uVar33,pBVar27 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,pBStack_b40);
          if (0x10 < uVar33) {
            pBVar11 = seqStore->lit;
            pBVar32 = pBVar11 + 0x10;
            lVar30 = (long)pBVar32 - (long)(pBStack_b40 + 0x10);
            if (lVar30 < 8 && -0x10 < lVar30) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar30 < 0x10 && -0x10 < lVar30) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar32,pBStack_b40 + 0x10);
            while (pBVar11 = pBVar11 + 0x20, pBVar11 < pBVar32 + (uVar33 - 0x10)) {
              op_8 = pBStack_b40 + 0x20;
              ZSTD_copy16(pBVar11,op_8);
              ZSTD_copy16(pBVar11 + 0x10,pBStack_b40 + 0x30);
              pBStack_b40 = op_8;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar33;
        if (0xffff < uVar33) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar33;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar29 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar29 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_0017d07e:
        pBStack_b40 = anchor_2 + h_2;
        anchor_2 = pBStack_b40;
        if (pBStack_b40 <= pBVar28) {
          if (pBVar6 + (ulong)uVar21 + 2 <= src) {
            __assert_fail("base+current+2 > istart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3e25,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          sVar29 = ZSTD_hashPtr(pBVar6 + (ulong)uVar21 + 2,UVar1,6);
          pUVar5[sVar29] = uVar21 + 2;
          sVar29 = ZSTD_hashPtr(pBStack_b40 + -2,UVar1,6);
          pUVar5[sVar29] = ((int)pBStack_b40 + -2) - iVar17;
          for (; uVar20 = local_b68, pBStack_b40 = anchor_2, anchor_2 <= pBVar28;
              anchor_2 = anchor_2 + sVar29 + 4) {
            UVar25 = (int)anchor_2 - iVar17;
            uVar21 = UVar25 - local_b68;
            if (uVar21 < uVar2) {
              local_f50 = pBVar9 + ((ulong)uVar21 - (ulong)uVar19);
            }
            else {
              local_f50 = pBVar6 + uVar21;
            }
            if ((uVar2 - 1) - uVar21 < 3) break;
            UVar23 = MEM_read32(local_f50);
            UVar24 = MEM_read32(anchor_2);
            if (UVar23 != UVar24) break;
            local_f60 = pBVar27;
            if (uVar21 < uVar2) {
              local_f60 = pBVar10;
            }
            sVar29 = ZSTD_count_2segments(anchor_2 + 4,local_f50 + 4,pBVar27,local_f60,pBVar26);
            local_b68 = offsetSaved_2;
            offsetSaved_2 = uVar20;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 < anchor_2) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 + -0x20 < anchor_2) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_2,anchor_2,pBVar27 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_2);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar29 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar29 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            sVar31 = ZSTD_hashPtr(anchor_2,UVar1,6);
            pUVar5[sVar31] = UVar25;
          }
        }
      }
      goto LAB_0017b9ff;
    }
    if (offsetSaved_2 == 0) {
      local_f78 = 0;
    }
    else {
      local_f78 = offsetSaved_2;
    }
    *rep = local_f78;
    if (local_b68 == 0) {
      local_f7c = 0;
    }
    else {
      local_f7c = local_b68;
    }
    rep[1] = local_f7c;
    ms_local = (ZSTD_matchState_t *)(pBVar27 + -(long)pBStack_b40);
    break;
  case 7:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar18 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
    pBVar6 = (ms->window).base;
    uVar2 = (ms->window).dictLimit;
    pBVar26 = pBVar6 + uVar2;
    pBVar27 = (BYTE *)((long)src + srcSize);
    pBVar28 = pBVar27 + -8;
    offsetSaved_3 = *rep;
    local_cd0 = rep[1];
    pZVar7 = ms->dictMatchState;
    pUVar8 = pZVar7->hashTable;
    uVar3 = (pZVar7->window).dictLimit;
    pBVar9 = (pZVar7->window).base;
    pBVar10 = (pZVar7->window).nextSrc;
    iVar12 = (int)pBVar10;
    uVar19 = uVar2 - (iVar12 - (int)pBVar9);
    iVar13 = (iVar15 - (int)pBVar26) + iVar12;
    iVar14 = (int)(pBVar9 + uVar3);
    uVar20 = iVar13 - iVar14;
    UVar4 = (pZVar7->cParams).hashLog;
    iVar17 = (int)pBVar6;
    if ((uint)(1 << ((byte)(ms->cParams).windowLog & 0x1f)) < ((iVar15 - iVar17) + iVar16) - uVar2)
    {
      __assert_fail("endIndex - prefixStartIndex <= maxDistance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3dd8,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (uVar2 < (uint)(iVar12 - (int)pBVar9)) {
      __assert_fail("prefixStartIndex >= (U32)(dictEnd - dictBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3ddd,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    anchor_3 = (BYTE *)((long)src + (long)(int)(uint)(iVar13 == iVar14));
    if (uVar20 < offsetSaved_3) {
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3de4,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    pBStack_ca8 = (BYTE *)src;
    if (uVar20 < local_cd0) {
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3de5,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
LAB_0017dd1f:
    UVar25 = offsetSaved_3;
    if (anchor_3 < pBVar28) {
      sVar29 = ZSTD_hashPtr(anchor_3,UVar1,7);
      uVar21 = (int)anchor_3 - iVar17;
      uVar20 = pUVar5[sVar29];
      pBStack_d48 = pBVar6 + uVar20;
      uVar22 = (uVar21 + 1) - offsetSaved_3;
      if (uVar22 < uVar2) {
        local_f88 = pBVar9 + (uVar22 - uVar19);
      }
      else {
        local_f88 = pBVar6 + uVar22;
      }
      pUVar5[sVar29] = uVar21;
      if ((uVar2 - 1) - uVar22 < 3) {
LAB_0017e4a5:
        if (uVar2 < uVar20) {
          UVar23 = MEM_read32(pBStack_d48);
          UVar24 = MEM_read32(anchor_3);
          if (UVar23 == UVar24) {
            offsetSaved_3 = (int)anchor_3 - (int)pBStack_d48;
            sVar29 = ZSTD_count(anchor_3 + 4,pBStack_d48 + 4,pBVar27);
            h_3 = sVar29 + 4;
            while( true ) {
              bVar34 = false;
              if (pBStack_ca8 < anchor_3 && pBVar26 < pBStack_d48) {
                bVar34 = anchor_3[-1] == pBStack_d48[-1];
              }
              if (!bVar34) break;
              anchor_3 = anchor_3 + -1;
              pBStack_d48 = pBStack_d48 + -1;
              h_3 = h_3 + 1;
            }
            uVar33 = (long)anchor_3 - (long)pBStack_ca8;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar33) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 < pBStack_ca8 + uVar33) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 + -0x20 < pBStack_ca8 + uVar33) {
              ZSTD_safecopyLiterals(seqStore->lit,pBStack_ca8,pBStack_ca8 + uVar33,pBVar27 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,pBStack_ca8);
              if (0x10 < uVar33) {
                pBVar11 = seqStore->lit;
                pBVar32 = pBVar11 + 0x10;
                lVar30 = (long)pBVar32 - (long)(pBStack_ca8 + 0x10);
                if (lVar30 < 8 && -0x10 < lVar30) {
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                if (lVar30 < 0x10 && -0x10 < lVar30) {
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1270,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                ZSTD_copy16(pBVar32,pBStack_ca8 + 0x10);
                while (pBVar11 = pBVar11 + 0x20, pBVar11 < pBVar32 + (uVar33 - 0x10)) {
                  op_14 = pBStack_ca8 + 0x20;
                  ZSTD_copy16(pBVar11,op_14);
                  ZSTD_copy16(pBVar11 + 0x10,pBStack_ca8 + 0x30);
                  pBStack_ca8 = op_14;
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar33;
            if (0xffff < uVar33) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar33;
            seqStore->sequences->offset = offsetSaved_3 + 3;
            if (0xffff < h_3 - 3) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(h_3 - 3);
            seqStore->sequences = seqStore->sequences + 1;
LAB_0017f39c:
            local_cd0 = UVar25;
            goto LAB_0017f39e;
          }
          if (uVar18 == 0) {
            __assert_fail("stepSize >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3e11,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          anchor_3 = anchor_3 + ((long)anchor_3 - (long)pBStack_ca8 >> 8) + (ulong)uVar18;
        }
        else {
          sVar29 = ZSTD_hashPtr(anchor_3,UVar4,7);
          uVar20 = pUVar8[sVar29];
          _offset_9 = pBVar9 + uVar20;
          if (uVar3 < uVar20) {
            UVar23 = MEM_read32(_offset_9);
            UVar24 = MEM_read32(anchor_3);
            if (UVar23 == UVar24) {
              offsetSaved_3 = (uVar21 - uVar20) - uVar19;
              sVar29 = ZSTD_count_2segments(anchor_3 + 4,_offset_9 + 4,pBVar27,pBVar10,pBVar26);
              h_3 = sVar29 + 4;
              while( true ) {
                bVar34 = false;
                if (pBStack_ca8 < anchor_3 && pBVar9 + uVar3 < _offset_9) {
                  bVar34 = anchor_3[-1] == _offset_9[-1];
                }
                if (!bVar34) break;
                anchor_3 = anchor_3 + -1;
                _offset_9 = _offset_9 + -1;
                h_3 = h_3 + 1;
              }
              uVar33 = (long)anchor_3 - (long)pBStack_ca8;
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
                __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2038,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (0x20000 < seqStore->maxNbLit) {
                __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203a,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar33) {
                __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203b,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (pBVar27 < pBStack_ca8 + uVar33) {
                __assert_fail("literals + litLength <= litLimit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203c,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (pBVar27 + -0x20 < pBStack_ca8 + uVar33) {
                ZSTD_safecopyLiterals
                          (seqStore->lit,pBStack_ca8,pBStack_ca8 + uVar33,pBVar27 + -0x20);
              }
              else {
                ZSTD_copy16(seqStore->lit,pBStack_ca8);
                if (0x10 < uVar33) {
                  pBVar11 = seqStore->lit;
                  pBVar32 = pBVar11 + 0x10;
                  lVar30 = (long)pBVar32 - (long)(pBStack_ca8 + 0x10);
                  if (lVar30 < 8 && -0x10 < lVar30) {
                    __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1268,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  if (lVar30 < 0x10 && -0x10 < lVar30) {
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1270,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  ZSTD_copy16(pBVar32,pBStack_ca8 + 0x10);
                  while (pBVar11 = pBVar11 + 0x20, pBVar11 < pBVar32 + (uVar33 - 0x10)) {
                    op_13 = pBStack_ca8 + 0x20;
                    ZSTD_copy16(pBVar11,op_13);
                    ZSTD_copy16(pBVar11 + 0x10,pBStack_ca8 + 0x30);
                    pBStack_ca8 = op_13;
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar33;
              if (0xffff < uVar33) {
                if (seqStore->longLengthID != 0) {
                  __assert_fail("seqStorePtr->longLengthID == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x204d,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->litLength = (U16)uVar33;
              seqStore->sequences->offset = offsetSaved_3 + 3;
              if (0xffff < h_3 - 3) {
                if (seqStore->longLengthID != 0) {
                  __assert_fail("seqStorePtr->longLengthID == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x2058,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
              }
              seqStore->sequences->matchLength = (U16)(h_3 - 3);
              seqStore->sequences = seqStore->sequences + 1;
              goto LAB_0017f39c;
            }
          }
          if (uVar18 == 0) {
            __assert_fail("stepSize >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3e00,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          anchor_3 = anchor_3 + ((long)anchor_3 - (long)pBStack_ca8 >> 8) + (ulong)uVar18;
        }
      }
      else {
        UVar23 = MEM_read32(local_f88);
        UVar24 = MEM_read32(anchor_3 + 1);
        if (UVar23 != UVar24) goto LAB_0017e4a5;
        local_f98 = pBVar27;
        if (uVar22 < uVar2) {
          local_f98 = pBVar10;
        }
        sVar29 = ZSTD_count_2segments(anchor_3 + 5,local_f88 + 4,pBVar27,local_f98,pBVar26);
        h_3 = sVar29 + 4;
        anchor_3 = anchor_3 + 1;
        uVar33 = (long)anchor_3 - (long)pBStack_ca8;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar33) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar27 < pBStack_ca8 + uVar33) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar27 + -0x20 < pBStack_ca8 + uVar33) {
          ZSTD_safecopyLiterals(seqStore->lit,pBStack_ca8,pBStack_ca8 + uVar33,pBVar27 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,pBStack_ca8);
          if (0x10 < uVar33) {
            pBVar11 = seqStore->lit;
            pBVar32 = pBVar11 + 0x10;
            lVar30 = (long)pBVar32 - (long)(pBStack_ca8 + 0x10);
            if (lVar30 < 8 && -0x10 < lVar30) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar30 < 0x10 && -0x10 < lVar30) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar32,pBStack_ca8 + 0x10);
            while (pBVar11 = pBVar11 + 0x20, pBVar11 < pBVar32 + (uVar33 - 0x10)) {
              op_12 = pBStack_ca8 + 0x20;
              ZSTD_copy16(pBVar11,op_12);
              ZSTD_copy16(pBVar11 + 0x10,pBStack_ca8 + 0x30);
              pBStack_ca8 = op_12;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar33;
        if (0xffff < uVar33) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar33;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar29 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar29 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_0017f39e:
        pBStack_ca8 = anchor_3 + h_3;
        anchor_3 = pBStack_ca8;
        if (pBStack_ca8 <= pBVar28) {
          if (pBVar6 + (ulong)uVar21 + 2 <= src) {
            __assert_fail("base+current+2 > istart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3e25,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          sVar29 = ZSTD_hashPtr(pBVar6 + (ulong)uVar21 + 2,UVar1,7);
          pUVar5[sVar29] = uVar21 + 2;
          sVar29 = ZSTD_hashPtr(pBStack_ca8 + -2,UVar1,7);
          pUVar5[sVar29] = ((int)pBStack_ca8 + -2) - iVar17;
          for (; uVar20 = local_cd0, pBStack_ca8 = anchor_3, anchor_3 <= pBVar28;
              anchor_3 = anchor_3 + sVar29 + 4) {
            UVar25 = (int)anchor_3 - iVar17;
            uVar21 = UVar25 - local_cd0;
            if (uVar21 < uVar2) {
              local_fd8 = pBVar9 + ((ulong)uVar21 - (ulong)uVar19);
            }
            else {
              local_fd8 = pBVar6 + uVar21;
            }
            if ((uVar2 - 1) - uVar21 < 3) break;
            UVar23 = MEM_read32(local_fd8);
            UVar24 = MEM_read32(anchor_3);
            if (UVar23 != UVar24) break;
            local_fe8 = pBVar27;
            if (uVar21 < uVar2) {
              local_fe8 = pBVar10;
            }
            sVar29 = ZSTD_count_2segments(anchor_3 + 4,local_fd8 + 4,pBVar27,local_fe8,pBVar26);
            local_cd0 = offsetSaved_3;
            offsetSaved_3 = uVar20;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 < anchor_3) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar27 + -0x20 < anchor_3) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_3,anchor_3,pBVar27 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_3);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar29 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar29 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            sVar31 = ZSTD_hashPtr(anchor_3,UVar1,7);
            pUVar5[sVar31] = UVar25;
          }
        }
      }
      goto LAB_0017dd1f;
    }
    if (offsetSaved_3 == 0) {
      local_1000 = 0;
    }
    else {
      local_1000 = offsetSaved_3;
    }
    *rep = local_1000;
    if (local_cd0 == 0) {
      local_1004 = 0;
    }
    else {
      local_1004 = local_cd0;
    }
    rep[1] = local_1004;
    ms_local = (ZSTD_matchState_t *)(pBVar27 + -(long)pBStack_ca8);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}